

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

SmallBuffer * helics::typeConvertDefV(DataType type,defV *val)

{
  char *pcVar1;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_RDX;
  char *in_RSI;
  SmallBuffer *in_RDI;
  NamedPoint *in_stack_000000f0;
  DataType in_stack_000000fc;
  double in_stack_00000100;
  DataType in_stack_0000010c;
  int64_t in_stack_00000150;
  DataType in_stack_0000015c;
  DataType in_stack_000001bc;
  undefined1 in_stack_000001c0 [16];
  complex<double> *in_stack_000001f0;
  DataType in_stack_000001fc;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_00000200;
  DataType in_stack_0000020c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  DataType in_stack_ffffffffffffffbc;
  
  pcVar1 = CLI::std::
           variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           ::index(in_RDX,in_RSI,(int)in_RDX);
  switch(pcVar1) {
  case (char *)0x0:
    std::
    get<double,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2ba51e);
    typeConvert(in_stack_0000010c,in_stack_00000100);
    break;
  case (char *)0x1:
    std::
    get<long,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2ba547);
    typeConvert(in_stack_0000015c,in_stack_00000150);
    break;
  case (char *)0x2:
  default:
    std::
    get<std::__cxx11::string,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2ba571);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    typeConvert(in_stack_000001bc,(string_view)in_stack_000001c0);
    break;
  case (char *)0x3:
    std::
    get<std::complex<double>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2ba5b2);
    typeConvert(in_stack_000001fc,in_stack_000001f0);
    break;
  case (char *)0x4:
    std::
    get<std::vector<double,std::allocator<double>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2ba5d7);
    typeConvert(in_stack_ffffffffffffffbc,
                (vector<double,_std::allocator<double>_> *)
                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    break;
  case (char *)0x5:
    std::
    get<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2ba5fc);
    typeConvert(in_stack_0000020c,in_stack_00000200);
    break;
  case (char *)0x6:
    std::
    get<helics::NamedPoint,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2ba621);
    typeConvert(in_stack_000000fc,in_stack_000000f0);
  }
  return in_RDI;
}

Assistant:

SmallBuffer typeConvertDefV(DataType type, const defV& val)
{
    switch (val.index()) {
        case double_loc:  // double
            return typeConvert(type, std::get<double>(val));
        case int_loc:  // int64_t
            return typeConvert(type, std::get<int64_t>(val));
        case string_loc:  // string
        default:
            return typeConvert(type, std::string_view{std::get<std::string>(val)});
        case complex_loc:  // complex
            return typeConvert(type, std::get<std::complex<double>>(val));
        case vector_loc:  // vector
            return typeConvert(type, std::get<std::vector<double>>(val));
        case complex_vector_loc:  // complex
            return typeConvert(type, std::get<std::vector<std::complex<double>>>(val));
        case named_point_loc:
            return typeConvert(type, std::get<NamedPoint>(val));
    }
}